

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall PhongShader::fragment(PhongShader *this,Model *model,vec3f bar,TGAColor *color)

{
  double dVar1;
  uint8_t auVar2 [4];
  TGAColor TVar3;
  size_t i_1;
  vec<3UL,_double> *pvVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  double *pdVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  vec3f i;
  vec2f uv;
  vec3f bn;
  vec3f j;
  mat<3UL,_3UL> B;
  mat<3UL,_3UL> A;
  mat<3UL,_3UL> AI;
  vec3f n;
  double local_1e8;
  double local_1e0;
  vec<3UL,_double> local_1d8;
  vec<3UL,_double> local_1b8;
  vec2f local_198;
  vec<3UL,_double> local_188;
  vec<3UL,_double> local_168;
  vec3f local_150;
  vec<3UL,_double> local_138;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  double local_108;
  double dStack_100;
  double local_f8 [2];
  mat<3UL,_3UL> local_e8;
  mat<3UL,_3UL> local_98;
  vec<3UL,_double> local_48;
  
  local_e8.rows[0].x = 0.0;
  local_e8.rows[0].y = 0.0;
  local_e8.rows[0].z = 0.0;
  lVar6 = 0;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_nrm).rows[2].x + lVar6),&bar)
    ;
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(double *)((long)&local_e8.rows[0].x + lVar5) = dVar1;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  pvVar4 = vec<3UL,_double>::normalize(local_e8.rows);
  local_188.x = pvVar4->x;
  local_188.y = pvVar4->y;
  local_188.z = pvVar4->z;
  local_1e8 = 0.0;
  lVar6 = 0;
  local_1e0 = 0.0;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_uv).rows[1].x + lVar6),&bar);
    if (lVar6 != -0x18) {
      local_1e8 = dVar1;
      dVar1 = local_1e0;
    }
    local_1e0 = dVar1;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x30);
  local_198.x = local_1e0;
  local_198.y = local_1e8;
  lVar6 = 0;
  local_e8.rows[2].z = 0.0;
  local_e8.rows[2].x = 0.0;
  local_e8.rows[2].y = 0.0;
  local_e8.rows[1].y = 0.0;
  local_e8.rows[1].z = 0.0;
  local_e8.rows[0].z = 0.0;
  local_e8.rows[1].x = 0.0;
  local_e8.rows[0].x = 0.0;
  local_e8.rows[0].y = 0.0;
  local_98.rows[0].z = 0.0;
  local_98.rows[0].x = 0.0;
  local_98.rows[0].y = 0.0;
  do {
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_98.rows[0].x + lVar5) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].y + lVar6);
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_138.z = 0.0;
  lVar6 = 0;
  do {
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_138.x + lVar5) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].x + lVar6);
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  operator-(local_e8.rows,local_98.rows,&local_138);
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_138.z = 0.0;
  lVar6 = 0;
  do {
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_138.x + lVar5) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].z + lVar6);
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  local_1b8.x = 0.0;
  local_1b8.y = 0.0;
  local_1b8.z = 0.0;
  lVar6 = 0;
  do {
    lVar5 = 0;
    if (lVar6 != -0x30) {
      lVar5 = (ulong)(lVar6 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_1b8.x + lVar5) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].x + lVar6);
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x48);
  operator-(local_98.rows,&local_138,&local_1b8);
  local_e8.rows[1].z = local_98.rows[0].z;
  local_e8.rows[1].x = local_98.rows[0].x;
  local_e8.rows[1].y = local_98.rows[0].y;
  local_e8.rows[2].x = local_188.x;
  local_e8.rows[2].y = local_188.y;
  local_e8.rows[2].z = local_188.z;
  mat<3UL,_3UL>::invert(&local_98,&local_e8);
  local_138.y = (this->varying_uv).rows[0].x;
  local_138.x = (this->varying_uv).rows[0].y - local_138.y;
  local_138.y = (this->varying_uv).rows[0].z - local_138.y;
  local_138.z = 0.0;
  local_1b8.x = 0.0;
  local_1b8.y = 0.0;
  local_1b8.z = 0.0;
  lVar6 = 0x30;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_98.rows[0].x + lVar6),&local_138);
    lVar5 = (ulong)(lVar6 != 0x18) * 8 + 8;
    if (lVar6 == 0) {
      lVar5 = 0;
    }
    *(double *)((long)&local_1b8.x + lVar5) = dVar1;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  local_138.y = (this->varying_uv).rows[1].x;
  local_138.x = (this->varying_uv).rows[1].y - local_138.y;
  local_138.y = (this->varying_uv).rows[1].z - local_138.y;
  local_138.z = 0.0;
  local_168.x = 0.0;
  local_168.y = 0.0;
  local_168.z = 0.0;
  lVar6 = 0x30;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_98.rows[0].x + lVar6),&local_138);
    lVar5 = (ulong)(lVar6 != 0x18) * 8 + 8;
    if (lVar6 == 0) {
      lVar5 = 0;
    }
    *(double *)((long)&local_168.x + lVar5) = dVar1;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  pdVar8 = &local_108;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_118 = 0;
  uStack_110 = 0;
  local_138.z = 0.0;
  uStack_120 = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_f8[0] = 0.0;
  pvVar4 = vec<3UL,_double>::normalize(&local_1b8);
  sVar7 = 2;
  do {
    dVar1 = vec<3UL,_double>::operator[](pvVar4,sVar7);
    *pdVar8 = dVar1;
    pdVar8 = pdVar8 + -3;
    bVar9 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar9);
  pvVar4 = vec<3UL,_double>::normalize(&local_168);
  sVar7 = 2;
  pdVar8 = &dStack_100;
  do {
    dVar1 = vec<3UL,_double>::operator[](pvVar4,sVar7);
    *pdVar8 = dVar1;
    pdVar8 = pdVar8 + -3;
    bVar9 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar9);
  sVar7 = 2;
  pdVar8 = local_f8;
  do {
    dVar1 = vec<3UL,_double>::operator[](&local_188,sVar7);
    *pdVar8 = dVar1;
    pdVar8 = pdVar8 + -3;
    bVar9 = sVar7 != 0;
    sVar7 = sVar7 - 1;
  } while (bVar9);
  Model::normal(&local_150,model,&local_198);
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_1d8.z = 0.0;
  lVar6 = 0x30;
  do {
    dVar1 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_138.x + lVar6),&local_150);
    lVar5 = (ulong)(lVar6 != 0x18) * 8 + 8;
    if (lVar6 == 0) {
      lVar5 = 0;
    }
    *(double *)((long)&local_1d8.x + lVar5) = dVar1;
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  pvVar4 = vec<3UL,_double>::normalize(&local_1d8);
  local_48.x = pvVar4->x;
  local_48.y = pvVar4->y;
  local_48.z = pvVar4->z;
  dVar1 = dot<3ul,double>(&local_48,&light_dir);
  uVar10 = SUB84(dVar1,0);
  uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= 0.0) {
    uVar10 = 0;
    uVar12 = 0;
  }
  TVar3 = Model::diffuse(model,&local_198);
  auVar2 = TVar3.bgra;
  local_150.x._0_1_ = auVar2[0];
  local_150.x._1_1_ = auVar2[1];
  local_150.x._2_1_ = auVar2[2];
  local_150.x._3_1_ = auVar2[3];
  local_1d8.x = (double)(ulong)(uint5)TVar3;
  uVar11 = 0;
  uVar13 = 0x3ff00000;
  if ((double)CONCAT44(uVar12,uVar10) <= 1.0) {
    uVar11 = uVar10;
    uVar13 = uVar12;
  }
  if ((double)CONCAT44(uVar13,uVar11) <= 0.0) {
    uVar11 = 0;
    uVar13 = 0;
  }
  lVar6 = 0;
  do {
    *(char *)((long)&local_1d8.x + lVar6) =
         (char)(int)((double)*(byte *)((long)&local_150.x + lVar6) * (double)CONCAT44(uVar13,uVar11)
                    );
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  color->bytespp = local_1d8.x._4_1_;
  *(undefined4 *)color->bgra = local_1d8.x._0_4_;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f bn = (varying_nrm * bar).normalize();
        vec2f uv = varying_uv * bar;

        mat<3, 3> A;
        A[0] = ndc_tri.col(1) - ndc_tri.col(0);
        A[1] = ndc_tri.col(2) - ndc_tri.col(0);
        A[2] = bn;

        mat<3, 3> AI = A.invert();

        vec3f i =
            AI * vec3f(varying_uv[0][1] - varying_uv[0][0], varying_uv[0][2] - varying_uv[0][0], 0);
        vec3f j =
            AI * vec3f(varying_uv[1][1] - varying_uv[1][0], varying_uv[1][2] - varying_uv[1][0], 0);

        mat<3, 3> B;
        B.set_col(0, i.normalize());
        B.set_col(1, j.normalize());
        B.set_col(2, bn);

        vec3f n = (B * model.normal(uv)).normalize();

        double diff = std::max(0., dot(n, light_dir));
        color = model.diffuse(uv) * diff;

        return false;
    }